

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Imputer::Imputer(Imputer *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Imputer_00427070;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  if (this != (Imputer *)&_Imputer_default_instance_) {
    protobuf_Imputer_2eproto::InitDefaults();
  }
  this->_oneof_case_[1] = 0;
  this->_cached_size_ = 0;
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

Imputer::Imputer()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_Imputer_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.Imputer)
}